

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_TextureMapping::HasMatchingCachedTextureCoordinates
          (ON_TextureMapping *this,ON_Mesh *mesh,ON_Xform *mesh_xform)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_TextureCoordinates *pOVar4;
  int local_28;
  int i;
  bool rc;
  ON_Xform *mesh_xform_local;
  ON_Mesh *mesh_local;
  ON_TextureMapping *this_local;
  
  local_28 = 0;
  do {
    iVar2 = ON_ClassArray<ON_TextureCoordinates>::Count(&mesh->m_TC);
    if (iVar2 <= local_28) {
      return false;
    }
    iVar2 = ON_Mesh::VertexCount(mesh);
    pOVar4 = ON_ClassArray<ON_TextureCoordinates>::operator[](&mesh->m_TC,local_28);
    iVar3 = ON_SimpleArray<ON_3fPoint>::Count(&pOVar4->m_T);
    if (iVar2 == iVar3) {
      pOVar4 = ON_ClassArray<ON_TextureCoordinates>::operator[](&mesh->m_TC,local_28);
      bVar1 = HasMatchingTextureCoordinates(this,&pOVar4->m_tag,mesh_xform);
      if (bVar1) {
        return true;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool ON_TextureMapping::HasMatchingCachedTextureCoordinates(
  const ON_Mesh& mesh,
  const ON_Xform* mesh_xform
) const
{
  bool rc = false;

  for (int i = 0; i < mesh.m_TC.Count(); i++)
  {
    if (mesh.VertexCount() == mesh.m_TC[i].m_T.Count() && HasMatchingTextureCoordinates(mesh.m_TC[i].m_tag, mesh_xform))
    {
      rc = true;
      break;
    }
  }

  return rc;
}